

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuffixTree.h
# Opt level: O3

bool __thiscall
flow::util::
SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
::lookup(SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
         *this,Key *key,Value *value)

{
  pointer pcVar1;
  Node *pNVar2;
  Value *pVVar3;
  const_iterator cVar4;
  size_type sVar5;
  
  sVar5 = key->_M_string_length;
  if (sVar5 != 0) {
    pcVar1 = (key->_M_dataplus)._M_p;
    do {
      cVar4 = std::
              _Hashtable<char,_std::pair<const_char,_std::unique_ptr<flow::util::SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node,_std::default_delete<flow::util::SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<flow::util::SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node,_std::default_delete<flow::util::SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->root_).children._M_h,pcVar1 + (sVar5 - 1));
      if (cVar4.
          super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<flow::util::SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node,_std::default_delete<flow::util::SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node>_>_>,_false>
          ._M_cur == (__node_type *)0x0) break;
      this = *(SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               **)((long)cVar4.
                         super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<flow::util::SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node,_std::default_delete<flow::util::SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node>_>_>,_false>
                         ._M_cur + 0x10);
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
  }
  while ((&this->root_ != (Node *)0x0 &&
         (pNVar2 = ((Node *)&(this->root_).parent)->parent, pNVar2 != (Node *)0x0))) {
    pVVar3 = &(this->root_).value;
    this = (SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
            *)pNVar2;
    if (*pVVar3 != 0) {
      *value = *pVVar3;
      return true;
    }
  }
  return false;
}

Assistant:

bool SuffixTree<K, V>::lookup(const Key& key, Value* value) const {
  const Node* level = &root_;

  for (auto i = key.rbegin(), e = key.rend(); i != e; ++i) {
    auto k = level->children.find(*i);
    if (k == level->children.end())
      break;

    level = k->second.get();
  }

  while (level && level->parent) {
    if (level->value) {
      *value = level->value;
      return true;
    }
    level = level->parent;
  }

  return false;
}